

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O3

void __thiscall inja::Parser::parse_into(Parser *this,Template *tmpl,string_view path)

{
  Token *this_00;
  Token *pTVar1;
  Kind KVar2;
  pointer pcVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  string_view path_00;
  string_view path_01;
  size_t sVar6;
  bool bVar7;
  long *plVar8;
  undefined8 *puVar9;
  long *plVar10;
  size_type *psVar11;
  string local_d0;
  string local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  Lexer *local_50;
  size_t local_48;
  char *local_40;
  basic_string_view<char,_std::char_traits<char>_> *local_38;
  
  local_40 = path._M_str;
  local_48 = path._M_len;
  local_50 = &this->m_lexer;
  pcVar3 = (tmpl->content)._M_dataplus._M_p;
  (this->m_lexer).m_in._M_len = (tmpl->content)._M_string_length;
  (this->m_lexer).m_in._M_str = pcVar3;
  (this->m_lexer).m_state = Text;
  (this->m_lexer).m_tok_start = 0;
  (this->m_lexer).m_pos = 0;
  this_00 = &this->m_tok;
  pTVar1 = &this->m_peek_tok;
  local_38 = &(this->m_tok).text;
LAB_0010bc54:
  if (this->m_have_peek_tok == true) {
    (this->m_tok).text._M_str = (this->m_peek_tok).text._M_str;
    uVar4 = *(undefined4 *)&(this->m_peek_tok).field_0x4;
    sVar6 = (this->m_peek_tok).text._M_len;
    uVar5 = *(undefined4 *)((long)&(this->m_peek_tok).text._M_len + 4);
    this_00->kind = pTVar1->kind;
    *(undefined4 *)&(this->m_tok).field_0x4 = uVar4;
    *(int *)&(this->m_tok).text._M_len = (int)sVar6;
    *(undefined4 *)((long)&(this->m_tok).text._M_len + 4) = uVar5;
    this->m_have_peek_tok = false;
  }
  else {
    Lexer::scan((Token *)&local_b0,local_50);
    (this->m_tok).text._M_str = (char *)local_b0.field_2._M_allocated_capacity;
    this_00->kind = (Kind)local_b0._M_dataplus._M_p;
    *(undefined4 *)&(this->m_tok).field_0x4 = local_b0._M_dataplus._M_p._4_4_;
    *(undefined4 *)&(this->m_tok).text._M_len = (undefined4)local_b0._M_string_length;
    *(undefined4 *)((long)&(this->m_tok).text._M_len + 4) = local_b0._M_string_length._4_4_;
  }
  switch(this_00->kind) {
  case Text:
    local_d0._M_dataplus._M_p._0_1_ = 1;
    local_b0._M_dataplus._M_p = local_b0._M_dataplus._M_p & 0xffffffff00000000;
    std::vector<inja::Bytecode,std::allocator<inja::Bytecode>>::
    emplace_back<inja::Bytecode::Op,std::basic_string_view<char,std::char_traits<char>>&,unsigned_int>
              ((vector<inja::Bytecode,std::allocator<inja::Bytecode>> *)tmpl,(Op *)&local_d0,
               local_38,(uint *)&local_b0);
    goto LAB_0010bc54;
  case ExpressionOpen:
    if (this->m_have_peek_tok == true) {
      (this->m_tok).text._M_str = (this->m_peek_tok).text._M_str;
      uVar4 = *(undefined4 *)&pTVar1->field_0x4;
      sVar6 = (this->m_peek_tok).text._M_len;
      this_00->kind = pTVar1->kind;
      *(undefined4 *)&this_00->field_0x4 = uVar4;
      (this->m_tok).text._M_len = sVar6;
      this->m_have_peek_tok = false;
    }
    else {
      Lexer::scan((Token *)&local_b0,local_50);
      (this->m_tok).text._M_str = (char *)local_b0.field_2._M_allocated_capacity;
      *(pointer *)this_00 = local_b0._M_dataplus._M_p;
      (this->m_tok).text._M_len =
           CONCAT44(local_b0._M_string_length._4_4_,(undefined4)local_b0._M_string_length);
    }
    bVar7 = parse_expression(this,tmpl);
    if (!bVar7) {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"parser_error","");
      Token::describe_abi_cxx11_(&local_70,this_00);
      puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x1332b4);
      local_90 = &local_80;
      plVar8 = puVar9 + 2;
      if ((long *)*puVar9 == plVar8) {
        local_80 = *plVar8;
        lStack_78 = puVar9[3];
      }
      else {
        local_80 = *plVar8;
        local_90 = (long *)*puVar9;
      }
      local_88 = puVar9[1];
      *puVar9 = plVar8;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_d0.field_2._M_allocated_capacity = *psVar11;
        local_d0.field_2._8_8_ = plVar8[3];
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar11;
        local_d0._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_d0._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      inja_throw(&local_b0,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,
                        (ulong)(local_b0.field_2._M_allocated_capacity + 1));
      }
    }
    append_function(this,tmpl,PrintValue,1);
    if ((this->m_tok).kind != ExpressionClose) {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"parser_error","");
      Token::describe_abi_cxx11_(&local_70,this_00);
      puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x1332cf);
      local_90 = &local_80;
      plVar8 = puVar9 + 2;
      if ((long *)*puVar9 == plVar8) {
        local_80 = *plVar8;
        lStack_78 = puVar9[3];
      }
      else {
        local_80 = *plVar8;
        local_90 = (long *)*puVar9;
      }
      local_88 = puVar9[1];
      *puVar9 = plVar8;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_d0.field_2._M_allocated_capacity = *psVar11;
        local_d0.field_2._8_8_ = plVar8[3];
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar11;
        local_d0._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_d0._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      inja_throw(&local_b0,&local_d0);
      break;
    }
    goto LAB_0010bc54;
  case ExpressionClose:
  case LineStatementClose:
  case StatementClose:
    goto switchD_0010bcb0_caseD_2;
  case LineStatementOpen:
    if (this->m_have_peek_tok == true) {
      (this->m_tok).text._M_str = (this->m_peek_tok).text._M_str;
      uVar4 = *(undefined4 *)&pTVar1->field_0x4;
      sVar6 = (this->m_peek_tok).text._M_len;
      this_00->kind = pTVar1->kind;
      *(undefined4 *)&this_00->field_0x4 = uVar4;
      (this->m_tok).text._M_len = sVar6;
      this->m_have_peek_tok = false;
    }
    else {
      Lexer::scan((Token *)&local_b0,local_50);
      (this->m_tok).text._M_str = (char *)local_b0.field_2._M_allocated_capacity;
      *(pointer *)this_00 = local_b0._M_dataplus._M_p;
      (this->m_tok).text._M_len =
           CONCAT44(local_b0._M_string_length._4_4_,(undefined4)local_b0._M_string_length);
    }
    path_01._M_str = local_40;
    path_01._M_len = local_48;
    parse_statement(this,tmpl,path_01);
    KVar2 = (this->m_tok).kind;
    if ((KVar2 == LineStatementClose) || (KVar2 == Eof)) goto LAB_0010bc54;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"parser_error","");
    Token::describe_abi_cxx11_(&local_70,this_00);
    puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x13328f);
    local_90 = &local_80;
    plVar8 = puVar9 + 2;
    if ((long *)*puVar9 == plVar8) {
      local_80 = *plVar8;
      lStack_78 = puVar9[3];
    }
    else {
      local_80 = *plVar8;
      local_90 = (long *)*puVar9;
    }
    local_88 = puVar9[1];
    *puVar9 = plVar8;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    psVar11 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_d0.field_2._M_allocated_capacity = *psVar11;
      local_d0.field_2._8_8_ = plVar8[3];
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar11;
      local_d0._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_d0._M_string_length = plVar8[1];
    *plVar8 = (long)psVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    inja_throw(&local_b0,&local_d0);
    break;
  case StatementOpen:
    if (this->m_have_peek_tok == true) {
      (this->m_tok).text._M_str = (this->m_peek_tok).text._M_str;
      uVar4 = *(undefined4 *)&pTVar1->field_0x4;
      sVar6 = (this->m_peek_tok).text._M_len;
      this_00->kind = pTVar1->kind;
      *(undefined4 *)&this_00->field_0x4 = uVar4;
      (this->m_tok).text._M_len = sVar6;
      this->m_have_peek_tok = false;
    }
    else {
      Lexer::scan((Token *)&local_b0,local_50);
      (this->m_tok).text._M_str = (char *)local_b0.field_2._M_allocated_capacity;
      *(pointer *)this_00 = local_b0._M_dataplus._M_p;
      (this->m_tok).text._M_len =
           CONCAT44(local_b0._M_string_length._4_4_,(undefined4)local_b0._M_string_length);
    }
    path_00._M_str = local_40;
    path_00._M_len = local_48;
    bVar7 = parse_statement(this,tmpl,path_00);
    if (!bVar7) {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"parser_error","");
      Token::describe_abi_cxx11_(&local_70,this_00);
      puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x133255);
      local_90 = &local_80;
      plVar8 = puVar9 + 2;
      if ((long *)*puVar9 == plVar8) {
        local_80 = *plVar8;
        lStack_78 = puVar9[3];
      }
      else {
        local_80 = *plVar8;
        local_90 = (long *)*puVar9;
      }
      local_88 = puVar9[1];
      *puVar9 = plVar8;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_d0.field_2._M_allocated_capacity = *psVar11;
        local_d0.field_2._8_8_ = plVar8[3];
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar11;
        local_d0._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_d0._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      inja_throw(&local_b0,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,
                        (ulong)(local_b0.field_2._M_allocated_capacity + 1));
      }
    }
    if (this_00->kind == StatementClose) goto LAB_0010bc54;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"parser_error","");
    Token::describe_abi_cxx11_(&local_70,this_00);
    puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x13326f);
    local_90 = &local_80;
    plVar8 = puVar9 + 2;
    if ((long *)*puVar9 == plVar8) {
      local_80 = *plVar8;
      lStack_78 = puVar9[3];
    }
    else {
      local_80 = *plVar8;
      local_90 = (long *)*puVar9;
    }
    local_88 = puVar9[1];
    *puVar9 = plVar8;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    psVar11 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_d0.field_2._M_allocated_capacity = *psVar11;
      local_d0.field_2._8_8_ = plVar8[3];
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar11;
      local_d0._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_d0._M_string_length = plVar8[1];
    *plVar8 = (long)psVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    inja_throw(&local_b0,&local_d0);
    break;
  case CommentOpen:
    goto switchD_0010bcb0_caseD_7;
  default:
    if (this_00->kind == Eof) {
      if ((this->m_if_stack).
          super__Vector_base<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (this->m_if_stack).
          super__Vector_base<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"parser_error","");
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"unmatched if","");
        inja_throw(&local_b0,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,
                          (ulong)(local_b0.field_2._M_allocated_capacity + 1));
        }
      }
      if ((this->m_loop_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (this->m_loop_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"parser_error","");
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"unmatched for","");
        inja_throw(&local_b0,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,
                          (ulong)(local_b0.field_2._M_allocated_capacity + 1));
        }
      }
      return;
    }
switchD_0010bcb0_caseD_2:
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"parser_error","");
    Token::describe_abi_cxx11_(&local_70,this_00);
    plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x13330e);
    local_90 = &local_80;
    plVar10 = plVar8 + 2;
    if ((long *)*plVar8 == plVar10) {
      local_80 = *plVar10;
      lStack_78 = plVar8[3];
    }
    else {
      local_80 = *plVar10;
      local_90 = (long *)*plVar8;
    }
    local_88 = plVar8[1];
    *plVar8 = (long)plVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    psVar11 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_d0.field_2._M_allocated_capacity = *psVar11;
      local_d0.field_2._8_8_ = plVar8[3];
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar11;
      local_d0._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_d0._M_string_length = plVar8[1];
    *plVar8 = (long)psVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    inja_throw(&local_b0,&local_d0);
  }
  goto LAB_0010c679;
switchD_0010bcb0_caseD_7:
  if (this->m_have_peek_tok == true) {
    (this->m_tok).text._M_str = (this->m_peek_tok).text._M_str;
    uVar4 = *(undefined4 *)&(this->m_peek_tok).field_0x4;
    sVar6 = (this->m_peek_tok).text._M_len;
    uVar5 = *(undefined4 *)((long)&(this->m_peek_tok).text._M_len + 4);
    this_00->kind = pTVar1->kind;
    *(undefined4 *)&(this->m_tok).field_0x4 = uVar4;
    *(int *)&(this->m_tok).text._M_len = (int)sVar6;
    *(undefined4 *)((long)&(this->m_tok).text._M_len + 4) = uVar5;
    this->m_have_peek_tok = false;
  }
  else {
    Lexer::scan((Token *)&local_b0,local_50);
    (this->m_tok).text._M_str = (char *)local_b0.field_2._M_allocated_capacity;
    this_00->kind = (Kind)local_b0._M_dataplus._M_p;
    *(undefined4 *)&(this->m_tok).field_0x4 = local_b0._M_dataplus._M_p._4_4_;
    *(undefined4 *)&(this->m_tok).text._M_len = (undefined4)local_b0._M_string_length;
    *(undefined4 *)((long)&(this->m_tok).text._M_len + 4) = local_b0._M_string_length._4_4_;
  }
  if (this_00->kind == CommentClose) goto LAB_0010bc54;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"parser_error","");
  Token::describe_abi_cxx11_(&local_70,this_00);
  puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x1332f0);
  local_90 = &local_80;
  plVar8 = puVar9 + 2;
  if ((long *)*puVar9 == plVar8) {
    local_80 = *plVar8;
    lStack_78 = puVar9[3];
  }
  else {
    local_80 = *plVar8;
    local_90 = (long *)*puVar9;
  }
  local_88 = puVar9[1];
  *puVar9 = plVar8;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  psVar11 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_d0.field_2._M_allocated_capacity = *psVar11;
    local_d0.field_2._8_8_ = plVar8[3];
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar11;
    local_d0._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_d0._M_string_length = plVar8[1];
  *plVar8 = (long)psVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  inja_throw(&local_b0,&local_d0);
LAB_0010c679:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,(ulong)(local_b0.field_2._M_allocated_capacity + 1));
  }
  goto LAB_0010bc54;
}

Assistant:

void parse_into(Template& tmpl, nonstd::string_view path) {
    m_lexer.start(tmpl.content);

    for (;;) {
      get_next_token();
      switch (m_tok.kind) {
        case Token::Kind::Eof:
          if (!m_if_stack.empty()) inja_throw("parser_error", "unmatched if");
          if (!m_loop_stack.empty()) inja_throw("parser_error", "unmatched for");
          return;
        case Token::Kind::Text:
          tmpl.bytecodes.emplace_back(Bytecode::Op::PrintText, m_tok.text, 0u);
          break;
        case Token::Kind::StatementOpen:
          get_next_token();
          if (!parse_statement(tmpl, path)) {
            inja_throw("parser_error", "expected statement, got '" + m_tok.describe() + "'");
          }
          if (m_tok.kind != Token::Kind::StatementClose) {
            inja_throw("parser_error", "expected statement close, got '" + m_tok.describe() + "'");
          }
          break;
        case Token::Kind::LineStatementOpen:
          get_next_token();
          parse_statement(tmpl, path);
          if (m_tok.kind != Token::Kind::LineStatementClose &&
              m_tok.kind != Token::Kind::Eof) {
            inja_throw("parser_error", "expected line statement close, got '" + m_tok.describe() + "'");
          }
          break;
        case Token::Kind::ExpressionOpen:
          get_next_token();
          if (!parse_expression(tmpl)) {
            inja_throw("parser_error", "expected expression, got '" + m_tok.describe() + "'");
          }
          append_function(tmpl, Bytecode::Op::PrintValue, 1);
          if (m_tok.kind != Token::Kind::ExpressionClose) {
            inja_throw("parser_error", "expected expression close, got '" + m_tok.describe() + "'");
          }
          break;
        case Token::Kind::CommentOpen:
          get_next_token();
          if (m_tok.kind != Token::Kind::CommentClose) {
            inja_throw("parser_error", "expected comment close, got '" + m_tok.describe() + "'");
          }
          break;
        default:
          inja_throw("parser_error", "unexpected token '" + m_tok.describe() + "'");
          break;
      }
    }
  }